

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O2

void __thiscall phyr::AccelBVH::constructBVH(AccelBVH *this)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  AccelBVH *this_00;
  BVHTreeNode *treeNode;
  LinearBVHNode *pLVar4;
  double *pdVar5;
  long lVar6;
  size_t i;
  size_t objectIdx;
  long lVar7;
  MemoryPool *pMVar8;
  size_t *psVar9;
  long lVar10;
  byte bVar11;
  int nodeCount;
  int linearIdx;
  vector<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_> objectInfoList;
  MemoryPool pool;
  int local_178 [2];
  vector<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_> local_170;
  AccelBVH *local_158;
  size_t local_150;
  Bounds3f local_148;
  _Vector_base<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_> local_118;
  MemoryPool local_100;
  
  bVar11 = 0;
  lVar7 = (long)(this->objectList).
                super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->objectList).
                super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    local_150 = lVar7 >> 4;
    local_158 = this;
    std::vector<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_>::vector
              ((vector<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_> *)&local_118,
               local_150,(allocator_type *)&local_100);
    lVar7 = 0;
    lVar10 = 0;
    for (objectIdx = 0; local_150 != objectIdx; objectIdx = objectIdx + 1) {
      (**(code **)(**(long **)((long)&(((local_158->objectList).
                                        super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super___shared_ptr<phyr::Object,_(__gnu_cxx::_Lock_policy)2>).
                                      _M_ptr + lVar7) + 0x10))(&local_148);
      BVHObjectInfo::BVHObjectInfo((BVHObjectInfo *)&local_100,objectIdx,&local_148);
      pMVar8 = &local_100;
      psVar9 = (size_t *)
               ((long)&(local_118._M_impl.super__Vector_impl_data._M_start)->objectIdx + lVar10);
      for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
        *psVar9 = pMVar8->blockSize;
        pMVar8 = (MemoryPool *)((long)pMVar8 + (ulong)bVar11 * -0x10 + 8);
        psVar9 = psVar9 + (ulong)bVar11 * -2 + 1;
      }
      lVar10 = lVar10 + 0x50;
      lVar7 = lVar7 + 0x10;
    }
    local_178[0] = 0;
    local_100.freeBlocks.
    super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_100.freeBlocks;
    local_100.blockSize = 0x100000;
    local_100.totalAllocSize = 0;
    local_100.curBlockOffset = 0;
    local_100.curAllocSize = 0;
    local_100.blockPtr = (uint8_t *)0x0;
    local_100.freeBlocks.
    super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
    ._M_impl._M_node._M_size = 0;
    local_100.usedBlocks.
    super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_100.usedBlocks;
    local_100.usedBlocks.
    super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
    ._M_impl._M_node._M_size = 0;
    local_170.
    super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_170.
    super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_170.
    super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_100.freeBlocks.
    super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         local_100.freeBlocks.
         super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    local_100.usedBlocks.
    super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         local_100.usedBlocks.
         super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    formatString<char_const*,int>
              ((string *)&local_148,"[%s] \x1b[37;1mINFO(%d):\x1b[0m Computing BVH tree...\n",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/methusael13[P]phy-ray/phyray_lib/src/core/accel/bvh.cpp"
               ,0x1e);
    std::operator<<((ostream *)&std::cout,(string *)&local_148);
    this_00 = local_158;
    std::__cxx11::string::~string((string *)&local_148);
    treeNode = constructBVHRecursive
                         (this_00,&local_100,
                          (vector<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_> *)
                          &local_118,0,(int)local_150,local_178,&local_170);
    psVar1 = (this_00->objectList).
             super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this_00->objectList).
    super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_170.
         super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    psVar2 = (this_00->objectList).
             super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (this_00->objectList).
             super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this_00->objectList).
    super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_170.
         super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this_00->objectList).
    super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_170.
         super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_170.
    super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar2;
    local_170.
    super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar3;
    local_170.
    super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar1;
    formatString<char_const*,int,int>
              ((string *)&local_148,"[%s] \x1b[37;1mINFO(%d):\x1b[0m Computed BVH nodes: %d\n",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/methusael13[P]phy-ray/phyray_lib/src/core/accel/bvh.cpp"
               ,0x22,local_178[0]);
    std::operator<<((ostream *)&std::cout,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    local_178[1] = 0;
    pLVar4 = allocAligned<phyr::LinearBVHNode>((long)local_178[0]);
    this_00->bvhNodes = pLVar4;
    pdVar5 = &(pLVar4->bounds).pMax.y;
    for (lVar7 = 0; lVar7 < local_178[0]; lVar7 = lVar7 + 1) {
      pdVar5[-4] = -1.79769313486232e+308;
      pdVar5[-3] = -1.79769313486232e+308;
      pdVar5[-2] = -1.79769313486232e+308;
      ((Point3<double> *)(pdVar5 + -1))->x = 1.79769313486232e+308;
      *pdVar5 = 1.79769313486232e+308;
      pdVar5[1] = 1.79769313486232e+308;
      pdVar5 = pdVar5 + 7;
    }
    formatString<char_const*,int>
              ((string *)&local_148,"[%s] \x1b[37;1mINFO(%d):\x1b[0m Flattening BVH nodes...\n",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/methusael13[P]phy-ray/phyray_lib/src/core/accel/bvh.cpp"
               ,0x2c);
    std::operator<<((ostream *)&std::cout,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    flattenBVH(this_00,treeNode,local_178 + 1);
    std::vector<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>::
    ~vector(&local_170);
    MemoryPool::~MemoryPool(&local_100);
    std::_Vector_base<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_>::~_Vector_base
              (&local_118);
  }
  return;
}

Assistant:

void AccelBVH::constructBVH() {
    if (objectList.size() == 0) return;

    // Initiate object info list
    size_t sz = objectList.size();
    std::vector<BVHObjectInfo> objectInfoList(sz);

    for (size_t i = 0; i < sz; i++)
        objectInfoList[i] = { i, objectList[i]->worldBounds() };

    // Create a BVH Tree from the object info list
    int nodeCount = 0;
    // Memory pool with a block size of 1MB
    MemoryPool pool(1024 * 1024);
    // Stores the ordered permutation of objectList as defined
    // by the recursive BVH algorithm
    std::vector<std::shared_ptr<Object>> orderedObjectList;

    // Recursively build the BVH Tree
    LOG_INFO("Computing BVH tree...");
    BVHTreeNode* root = constructBVHRecursive(pool, objectInfoList, 0, sz,
                                              &nodeCount, orderedObjectList);
    objectList.swap(orderedObjectList);
    LOG_INFO_FMT("Computed BVH nodes: %d", nodeCount);

    // Compute linear BVH by DFS on {root}
    int linearIdx = 0;
    bvhNodes = allocAligned<LinearBVHNode>(nodeCount);
    // Initilize components in {LinearBVHNode}
    for (int i = 0; i < nodeCount; i++)
        new (&bvhNodes[i]) LinearBVHNode();

    // Transform BVH tree to a BVH linear array
    LOG_INFO("Flattening BVH nodes...");
    flattenBVH(root, &linearIdx);
    ASSERT(linearIdx == nodeCount);
}